

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_CreateBlockMap(void)

{
  double dVar1;
  DVector2 DVar2;
  long lVar3;
  void *__s;
  int *piVar4;
  uint uVar5;
  size_t size;
  long lVar6;
  int iVar7;
  ulong uVar8;
  size_t __n;
  ulong uVar9;
  TArray<int,_int> *pTVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  TArray<int,_int> *this;
  TArray<int,_int> *pTVar16;
  long *plVar17;
  int iVar18;
  ulong uVar19;
  undefined4 uVar20;
  uint uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  uint uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  int iVar28;
  undefined4 uVar29;
  int iVar30;
  int iVar31;
  double dVar32;
  int iVar34;
  undefined1 auVar33 [16];
  int iVar35;
  int iVar37;
  uint uVar38;
  undefined1 auVar36 [16];
  uint uVar39;
  uint uVar40;
  TArray<int,_int> BlockMap;
  TArray<int,_int> local_40c8;
  int local_40b8;
  uint local_40b4;
  ulong local_40b0;
  long local_40a8;
  long *local_40a0;
  int local_4094;
  TArray<int,_int> *local_4090;
  long local_4088;
  long local_4080;
  long local_4078;
  long local_4070;
  ulong local_4068;
  long *local_4060;
  long local_4058;
  ulong local_4050;
  undefined8 local_4048;
  undefined8 uStack_4040;
  int local_4038 [4098];
  
  if (0 < numvertexes) {
    DVar2 = vertexes->p;
    uVar20 = DVar2.X._0_4_;
    uVar22 = DVar2.X._4_4_;
    uVar25 = DVar2.Y._0_4_;
    uVar26 = DVar2.Y._4_4_;
    dVar32 = DVar2.Y;
    auVar36._8_8_ = dVar32;
    auVar36._0_8_ = dVar32;
    uVar27 = uVar20;
    uVar29 = uVar22;
    if (numvertexes != 1) {
      lVar6 = 0x38;
      uVar25 = uVar20;
      uVar26 = uVar22;
      do {
        dVar1 = *(double *)((long)&(vertexes->p).X + lVar6);
        uVar23 = (undefined4)((ulong)dVar1 >> 0x20);
        uVar20 = SUB84(dVar1,0);
        uVar22 = uVar23;
        if (((double)CONCAT44(uVar26,uVar25) < dVar1 || (double)CONCAT44(uVar26,uVar25) == dVar1) &&
           (uVar20 = uVar25, uVar22 = uVar26,
           (double)CONCAT44(uVar29,uVar27) <= dVar1 && dVar1 != (double)CONCAT44(uVar29,uVar27))) {
          uVar27 = SUB84(dVar1,0);
          uVar29 = uVar23;
        }
        dVar1 = *(double *)((long)&(vertexes->p).Y + lVar6);
        if (auVar36._0_8_ <= dVar1) {
          if (dVar32 < dVar1) {
            dVar32 = dVar1;
          }
        }
        else {
          auVar36._8_8_ = 0;
          auVar36._0_8_ = dVar1;
        }
        lVar6 = lVar6 + 0x38;
        uVar25 = uVar20;
        uVar26 = uVar22;
      } while ((ulong)(uint)numvertexes * 0x38 - lVar6 != 0);
      uVar25 = auVar36._0_4_;
      uVar26 = auVar36._4_4_;
    }
    iVar35 = (int)(double)CONCAT44(uVar22,uVar20);
    iVar37 = (int)(double)CONCAT44(uVar26,uVar25);
    local_4048 = CONCAT44(iVar37,iVar35);
    uStack_4040 = 0;
    iVar18 = (int)(double)CONCAT44(uVar29,uVar27) - iVar35 >> 7;
    local_40b8 = iVar18 + 1;
    local_4094 = ((int)dVar32 - iVar37 >> 7) + 1;
    uVar5 = local_40b8 * local_4094;
    local_40b0 = (ulong)uVar5;
    local_40c8.Most = uVar5 * 3 + 4;
    local_40c8.Count = 0;
    local_40c8.Array =
         (int *)M_Malloc_Dbg((long)(int)(uVar5 * 3) * 4 + 0x10,
                             "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                             ,0x91);
    TArray<int,_int>::Grow(&local_40c8,1);
    local_40c8.Array[local_40c8.Count] = iVar35;
    local_40c8.Count = local_40c8.Count + 1;
    TArray<int,_int>::Grow(&local_40c8,1);
    local_40c8.Array[local_40c8.Count] = iVar37;
    local_40c8.Count = local_40c8.Count + 1;
    TArray<int,_int>::Grow(&local_40c8,1);
    local_40c8.Array[local_40c8.Count] = local_40b8;
    local_40c8.Count = local_40c8.Count + 1;
    TArray<int,_int>::Grow(&local_40c8,1);
    local_40c8.Array[local_40c8.Count] = local_4094;
    local_40c8.Count = local_40c8.Count + 1;
    iVar35 = (int)local_40b0;
    __n = (long)iVar35 * 0x10;
    uVar19 = 0xffffffffffffffff;
    if (-1 < iVar35) {
      uVar19 = __n + 8;
    }
    local_4060 = (long *)operator_new__(uVar19);
    *local_4060 = (long)iVar35;
    local_40a0 = local_4060 + 1;
    if ((int)local_40b0 != 0) {
      memset(local_40a0,0,__n);
    }
    if (0 < numlines) {
      local_4058 = (long)iVar18 * 0x10 + 0x10;
      lVar6 = 0;
      iVar35 = local_40b8;
      do {
        lVar3 = local_4058;
        iVar31 = (int)((lines[lVar6].v1)->p).X;
        iVar34 = (int)((lines[lVar6].v1)->p).Y;
        iVar28 = (int)((lines[lVar6].v2)->p).X;
        iVar30 = (int)((lines[lVar6].v2)->p).Y;
        uVar21 = iVar31 - (int)local_4048;
        uVar24 = iVar34 - local_4048._4_4_;
        uVar5 = (int)uVar21 >> 7;
        uVar38 = (int)uVar24 >> 7;
        uVar39 = iVar28 - (int)local_4048 >> 7;
        uVar40 = iVar30 - local_4048._4_4_ >> 7;
        iVar18 = uVar38 * iVar35 + uVar5;
        this = (TArray<int,_int> *)(local_40a0 + (long)iVar18 * 2);
        local_40a8 = CONCAT44(local_40a8._4_4_,uVar39);
        iVar37 = uVar40 * iVar35 + uVar39;
        iVar7 = (int)lVar6;
        if (iVar18 == iVar37) {
          TArray<int,_int>::Grow(this,1);
          this->Array[this->Count] = iVar7;
          pTVar16 = this;
LAB_00565e90:
          pTVar16->Count = pTVar16->Count + 1;
        }
        else {
          pTVar10 = (TArray<int,_int> *)(local_40a0 + (long)iVar37 * 2);
          if (uVar38 == uVar40) {
            pTVar16 = this;
            if ((int)uVar39 < (int)uVar5) {
              pTVar16 = pTVar10;
              pTVar10 = this;
            }
            do {
              TArray<int,_int>::Grow(pTVar16,1);
              pTVar16->Array[pTVar16->Count] = iVar7;
              pTVar16->Count = pTVar16->Count + 1;
              pTVar16 = pTVar16 + 1;
            } while (pTVar16 <= pTVar10);
          }
          else {
            local_4090 = pTVar10;
            if (uVar5 != uVar39) {
              iVar28 = iVar28 - iVar31;
              iVar30 = iVar30 - iVar34;
              uVar19 = CONCAT44(iVar30,iVar28) ^ CONCAT44(iVar30 >> 0x1f,iVar28 >> 0x1f);
              iVar18 = (int)uVar19 - (iVar28 >> 0x1f);
              iVar37 = (int)(uVar19 >> 0x20) - (iVar30 >> 0x1f);
              if (iVar18 == iVar37) {
                uVar39 = ~-(uint)(iVar30 < 0) & uVar24 & 0x7f |
                         0x80 - (uVar24 & 0x7f) & -(uint)(iVar30 < 0);
                iVar18 = iVar18 - (uint)((~-(uint)(iVar28 < 0) & uVar21 & 0x7f |
                                         0x80 - (uVar21 & 0x7f) & -(uint)(iVar28 < 0)) < uVar39);
              }
              auVar33._4_4_ = iVar28;
              auVar33._0_4_ = iVar28;
              auVar33._8_4_ = iVar30;
              auVar33._12_4_ = iVar30;
              uVar39 = movmskpd(uVar39,auVar33);
              uVar12 = -(uVar39 & 1) | 1;
              uVar15 = -(uVar39 >> 1 & 0x7f);
              uVar13 = uVar15 | 1;
              iVar35 = uVar13 * iVar35;
              if (iVar18 < iVar37) {
                local_4070 = CONCAT44(local_4070._4_4_,(-(uVar39 & 1) | 0x80) - uVar21);
                local_4078 = (long)iVar30;
                local_4080 = (long)iVar28;
                local_4088 = (long)(int)uVar12;
                uVar19 = (ulong)uVar5;
                local_40b4 = uVar24;
                do {
                  uVar39 = (int)((int)((((int)uVar19 * 0x80 + (int)local_4070) * local_4078) /
                                      local_4080) + local_40b4) >> 7;
                  local_4068 = uVar19;
                  pTVar10 = this;
                  for (uVar5 = uVar38; uVar5 != uVar39; uVar5 = uVar5 + uVar13) {
                    TArray<int,_int>::Grow(pTVar10,1);
                    pTVar10->Array[pTVar10->Count] = iVar7;
                    pTVar10->Count = pTVar10->Count + 1;
                    pTVar10 = pTVar10 + iVar35;
                    uVar38 = uVar39;
                  }
                  TArray<int,_int>::Grow(pTVar10,1);
                  pTVar16 = local_4090;
                  pTVar10->Array[pTVar10->Count] = iVar7;
                  pTVar10->Count = pTVar10->Count + 1;
                  this = pTVar10 + local_4088;
                  uVar19 = local_4068 + local_4088;
                } while ((int)local_40a8 != (int)uVar19);
                if (this != local_4090) {
                  pTVar10 = pTVar10 + local_4088;
                  do {
                    TArray<int,_int>::Grow(pTVar10,1);
                    pTVar10->Array[pTVar10->Count] = iVar7;
                    pTVar10->Count = pTVar10->Count + 1;
                    pTVar10 = pTVar10 + iVar35;
                  } while (pTVar10 != pTVar16);
                }
                TArray<int,_int>::Grow(pTVar16,1);
              }
              else {
                local_40b4 = (uVar15 | 0x80) - uVar24;
                local_40a8 = (long)iVar28;
                local_4070 = (long)iVar30;
                local_4088 = (long)iVar35;
                uVar19 = (ulong)uVar38;
                local_4050 = (ulong)uVar13;
                local_4078 = CONCAT44(local_4078._4_4_,uVar21);
                local_4080 = CONCAT44(local_4080._4_4_,uVar40);
                do {
                  uVar39 = (int)(((int)((int)uVar19 * 0x80 + local_40b4) * local_40a8) / local_4070)
                           + (int)local_4078 >> 7;
                  local_4068 = uVar19;
                  pTVar10 = this;
                  for (uVar38 = uVar5; uVar38 != uVar39; uVar38 = uVar38 + uVar12) {
                    TArray<int,_int>::Grow(pTVar10,1);
                    pTVar10->Array[pTVar10->Count] = iVar7;
                    pTVar10->Count = pTVar10->Count + 1;
                    pTVar10 = pTVar10 + (int)uVar12;
                    uVar5 = uVar39;
                  }
                  TArray<int,_int>::Grow(pTVar10,1);
                  pTVar16 = local_4090;
                  pTVar10->Array[pTVar10->Count] = iVar7;
                  pTVar10->Count = pTVar10->Count + 1;
                  this = pTVar10 + local_4088;
                  uVar19 = local_4068 + local_4050;
                } while ((int)local_4080 != (int)uVar19);
                if (this != local_4090) {
                  pTVar10 = pTVar10 + local_4088;
                  do {
                    TArray<int,_int>::Grow(pTVar10,1);
                    pTVar10->Array[pTVar10->Count] = iVar7;
                    pTVar10->Count = pTVar10->Count + 1;
                    pTVar10 = pTVar10 + (int)uVar12;
                  } while (pTVar10 != pTVar16);
                }
                TArray<int,_int>::Grow(pTVar16,1);
              }
              pTVar16->Array[pTVar16->Count] = iVar7;
              iVar35 = local_40b8;
              goto LAB_00565e90;
            }
            pTVar16 = this;
            if ((int)uVar40 < (int)uVar38) {
              pTVar16 = pTVar10;
              pTVar10 = this;
            }
            do {
              TArray<int,_int>::Grow(pTVar16,1);
              pTVar16->Array[pTVar16->Count] = iVar7;
              pTVar16->Count = pTVar16->Count + 1;
              pTVar16 = (TArray<int,_int> *)((long)&pTVar16->Array + lVar3);
            } while (pTVar16 <= pTVar10);
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < numlines);
    }
    TArray<int,_int>::Grow(&local_40c8,(uint)local_40b0);
    local_40c8.Count = local_40c8.Count + (int)local_40b0;
    uVar8 = local_40b0 & 0xffffffff;
    uVar19 = 0xffffffffffffffff;
    if (-1 < (int)local_40b0) {
      uVar19 = uVar8 * 4;
    }
    __s = operator_new__(uVar19);
    memset(__s,0xff,(long)local_4094 * (long)local_40b8 * 4);
    memset(local_4038,0xff,0x4000);
    if (0 < (int)local_40b0) {
      uVar19 = 0;
      do {
        uVar5 = *(uint *)((long)local_40a0 + uVar19 * 0x10 + 0xc);
        uVar9 = (ulong)uVar5;
        if (uVar9 == 0) {
          uVar11 = 0;
        }
        else {
          uVar11 = 0;
          uVar38 = 0;
          do {
            uVar38 = uVar38 * 0x2fcb + *(int *)(local_40a0[uVar19 * 2] + uVar11 * 4);
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
          uVar11 = (ulong)(uVar38 & 0xfff);
        }
        iVar35 = local_4038[uVar11];
        while (iVar35 != -1) {
          lVar6 = (long)iVar35;
          if (uVar5 == *(uint *)((long)local_40a0 + lVar6 * 0x10 + 0xc)) {
            if (uVar9 == 0) {
LAB_00566453:
              local_40c8.Array[uVar19 + 4] = local_40c8.Array[lVar6 + 4];
              goto LAB_00566461;
            }
            uVar14 = 0;
            while (*(int *)(local_40a0[uVar19 * 2] + uVar14 * 4) ==
                   *(int *)(local_40a0[lVar6 * 2] + uVar14 * 4)) {
              uVar14 = uVar14 + 1;
              if (uVar9 == uVar14) goto LAB_00566453;
            }
          }
          iVar35 = *(int *)((long)__s + lVar6 * 4);
        }
        *(int *)((long)__s + uVar19 * 4) = local_4038[uVar11];
        local_4038[uVar11] = (int)uVar19;
        local_40c8.Array[uVar19 + 4] = local_40c8.Count;
        TArray<int,_int>::Grow(&local_40c8,1);
        local_40c8.Array[local_40c8.Count] = 0;
        local_40c8.Count = local_40c8.Count + 1;
        plVar17 = local_40a0 + uVar19 * 2;
        if (*(int *)((long)plVar17 + 0xc) != 0) {
          lVar6 = *plVar17;
          uVar9 = 0;
          do {
            TArray<int,_int>::Grow(&local_40c8,1);
            local_40c8.Array[local_40c8.Count] = *(int *)(lVar6 + uVar9 * 4);
            local_40c8.Count = local_40c8.Count + 1;
            uVar9 = uVar9 + 1;
          } while (uVar9 < *(uint *)((long)plVar17 + 0xc));
        }
        TArray<int,_int>::Grow(&local_40c8,1);
        local_40c8.Array[local_40c8.Count] = -1;
        local_40c8.Count = local_40c8.Count + 1;
LAB_00566461:
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar8);
    }
    operator_delete__(__s);
    plVar17 = local_4060;
    lVar6 = *local_4060 * 0x10;
    uVar19 = lVar6 + 8;
    lVar3 = *local_4060;
    while (lVar3 != 0) {
      TArray<int,_int>::~TArray((TArray<int,_int> *)((long)plVar17 + lVar6 + -8));
      lVar6 = lVar6 + -0x10;
      lVar3 = lVar6;
    }
    operator_delete__(plVar17,uVar19);
    uVar19 = (ulong)local_40c8.Count;
    piVar4 = (int *)operator_new__(uVar19 * 4);
    blockmaplump = piVar4;
    if (uVar19 != 0) {
      uVar8 = 0;
      do {
        piVar4[uVar8] = local_40c8.Array[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar19 != uVar8);
    }
    TArray<int,_int>::~TArray(&local_40c8);
  }
  return;
}

Assistant:

static void P_CreateBlockMap ()
{
	TArray<int> *BlockLists, *block, *endblock;
	int adder;
	int bmapwidth, bmapheight;
	double dminx, dmaxx, dminy, dmaxy;
	int minx, maxx, miny, maxy;
	int i;
	int line;

	if (numvertexes <= 0)
		return;

	// Find map extents for the blockmap
	dminx = dmaxx = vertexes[0].fX();
	dminy = dmaxy = vertexes[0].fY();

	for (i = 1; i < numvertexes; ++i)
	{
			 if (vertexes[i].fX() < dminx) dminx = vertexes[i].fX();
		else if (vertexes[i].fX() > dmaxx) dmaxx = vertexes[i].fX();
			 if (vertexes[i].fY() < dminy) dminy = vertexes[i].fY();
		else if (vertexes[i].fY() > dmaxy) dmaxy = vertexes[i].fY();
	}

	minx = int(dminx);
	miny = int(dminy);
	maxx = int(dmaxx);
	maxy = int(dmaxy);

	bmapwidth =	 ((maxx - minx) >> BLOCKBITS) + 1;
	bmapheight = ((maxy - miny) >> BLOCKBITS) + 1;

	TArray<int> BlockMap (bmapwidth * bmapheight * 3 + 4);

	adder = minx;			BlockMap.Push (adder);
	adder = miny;			BlockMap.Push (adder);
	adder = bmapwidth;		BlockMap.Push (adder);
	adder = bmapheight;		BlockMap.Push (adder);

	BlockLists = new TArray<int>[bmapwidth * bmapheight];

	for (line = 0; line < numlines; ++line)
	{
		int x1 = int(lines[line].v1->fX());
		int y1 = int(lines[line].v1->fY());
		int x2 = int(lines[line].v2->fX());
		int y2 = int(lines[line].v2->fY());
		int dx = x2 - x1;
		int dy = y2 - y1;
		int bx = (x1 - minx) >> BLOCKBITS;
		int by = (y1 - miny) >> BLOCKBITS;
		int bx2 = (x2 - minx) >> BLOCKBITS;
		int by2 = (y2 - miny) >> BLOCKBITS;

		block = &BlockLists[bx + by * bmapwidth];
		endblock = &BlockLists[bx2 + by2 * bmapwidth];

		if (block == endblock)	// Single block
		{
			block->Push (line);
		}
		else if (by == by2)		// Horizontal line
		{
			if (bx > bx2)
			{
				swapvalues (block, endblock);
			}
			do
			{
				block->Push (line);
				block += 1;
			} while (block <= endblock);
		}
		else if (bx == bx2)	// Vertical line
		{
			if (by > by2)
			{
				swapvalues (block, endblock);
			}
			do
			{
				block->Push (line);
				block += bmapwidth;
			} while (block <= endblock);
		}
		else				// Diagonal line
		{
			int xchange = (dx < 0) ? -1 : 1;
			int ychange = (dy < 0) ? -1 : 1;
			int ymove = ychange * bmapwidth;
			int adx = abs (dx);
			int ady = abs (dy);

			if (adx == ady)		// 45 degrees
			{
				int xb = (x1 - minx) & (BLOCKSIZE-1);
				int yb = (y1 - miny) & (BLOCKSIZE-1);
				if (dx < 0)
				{
					xb = BLOCKSIZE-xb;
				}
				if (dy < 0)
				{
					yb = BLOCKSIZE-yb;
				}
				if (xb < yb)
					adx--;
			}
			if (adx >= ady)		// X-major
			{
				int yadd = dy < 0 ? -1 : BLOCKSIZE;
				do
				{
					int stop = (Scale ((by << BLOCKBITS) + yadd - (y1 - miny), dx, dy) + (x1 - minx)) >> BLOCKBITS;
					while (bx != stop)
					{
						block->Push (line);
						block += xchange;
						bx += xchange;
					}
					block->Push (line);
					block += ymove;
					by += ychange;
				} while (by != by2);
				while (block != endblock)
				{
					block->Push (line);
					block += xchange;
				}
				block->Push (line);
			}
			else					// Y-major
			{
				int xadd = dx < 0 ? -1 : BLOCKSIZE;
				do
				{
					int stop = (Scale ((bx << BLOCKBITS) + xadd - (x1 - minx), dy, dx) + (y1 - miny)) >> BLOCKBITS;
					while (by != stop)
					{
						block->Push (line);
						block += ymove;
						by += ychange;
					}
					block->Push (line);
					block += xchange;
					bx += xchange;
				} while (bx != bx2);
				while (block != endblock)
				{
					block->Push (line);
					block += ymove;
				}
				block->Push (line);
			}
		}
	}

	BlockMap.Reserve (bmapwidth * bmapheight);
	CreatePackedBlockmap (BlockMap, BlockLists, bmapwidth, bmapheight);
	delete[] BlockLists;

	blockmaplump = new int[BlockMap.Size()];
	for (unsigned int ii = 0; ii < BlockMap.Size(); ++ii)
	{
		blockmaplump[ii] = BlockMap[ii];
	}
}